

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE qpdf_update_from_json_file(qpdf_data qpdf,char *filename)

{
  anon_class_8_1_bc207785 local_48;
  function<void_(_qpdf_data_*)> local_40;
  QPDF_ERROR_CODE local_1c;
  char *pcStack_18;
  QPDF_ERROR_CODE status;
  char *filename_local;
  qpdf_data qpdf_local;
  
  local_1c = 0;
  local_48.filename = filename;
  pcStack_18 = filename;
  filename_local = (char *)qpdf;
  std::function<void(_qpdf_data*)>::function<qpdf_update_from_json_file::__0,void>
            ((function<void(_qpdf_data*)> *)&local_40,&local_48);
  local_1c = trap_errors(qpdf,&local_40);
  std::function<void_(_qpdf_data_*)>::~function(&local_40);
  return local_1c;
}

Assistant:

QPDF_ERROR_CODE
qpdf_update_from_json_file(qpdf_data qpdf, char const* filename)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    status = trap_errors(qpdf, [filename](qpdf_data q) { q->qpdf->updateFromJSON(filename); });
    return status;
}